

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_hint_table_activate_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  PSH_Hint_conflict *ppPVar2;
  PSH_Hint_conflict pPVar3;
  PSH_Hint_conflict *sort;
  PSH_Hint_conflict hint2;
  PSH_Hint_conflict hint1;
  uint local_48;
  FT_UInt i2;
  FT_UInt i1;
  FT_UInt count2;
  PSH_Hint_conflict hint;
  FT_UInt count;
  FT_UInt limit;
  FT_UInt idx;
  FT_Byte *cursor;
  FT_Int val;
  FT_Int mask;
  PS_Mask hint_mask_local;
  PSH_Hint_Table table_local;
  
  cursor._4_4_ = 0;
  cursor._0_4_ = 0;
  _limit = hint_mask->bytes;
  uVar1 = hint_mask->num_bits;
  hint._4_4_ = 0;
  psh_hint_table_deactivate(table);
  for (count = 0; count < uVar1; count = count + 1) {
    if (cursor._4_4_ == 0) {
      cursor._0_4_ = (uint)*_limit;
      cursor._4_4_ = 0x80;
      _limit = _limit + 1;
    }
    if (((((uint)cursor & cursor._4_4_) != 0) &&
        (pPVar3 = table->hints + count, (pPVar3->flags & 4) == 0)) &&
       (pPVar3->flags = pPVar3->flags | 4, hint._4_4_ < table->max_hints)) {
      table->sort[hint._4_4_] = pPVar3;
      hint._4_4_ = hint._4_4_ + 1;
    }
    cursor._4_4_ = (int)cursor._4_4_ >> 1;
  }
  table->num_hints = hint._4_4_;
  ppPVar2 = table->sort;
  for (local_48 = 1; local_48 < hint._4_4_; local_48 = local_48 + 1) {
    pPVar3 = ppPVar2[local_48];
    uVar1 = local_48;
    while ((hint1._4_4_ = uVar1 - 1, hint1._4_4_ < local_48 &&
           (pPVar3->org_pos <= ppPVar2[hint1._4_4_]->org_pos))) {
      ppPVar2[uVar1] = ppPVar2[hint1._4_4_];
      ppPVar2[hint1._4_4_] = pPVar3;
      uVar1 = hint1._4_4_;
    }
  }
  return;
}

Assistant:

static void
  psh_hint_table_activate_mask( PSH_Hint_Table  table,
                                PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit, count;


    limit = hint_mask->num_bits;
    count = 0;

    psh_hint_table_deactivate( table );

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
      {
        PSH_Hint  hint = &table->hints[idx];


        if ( !psh_hint_is_active( hint ) )
        {
          FT_UInt     count2;

#if 0
          PSH_Hint*  sort = table->sort;
          PSH_Hint   hint2;


          for ( count2 = count; count2 > 0; count2--, sort++ )
          {
            hint2 = sort[0];
            if ( psh_hint_overlap( hint, hint2 ) )
              FT_TRACE0(( "psh_hint_table_activate_mask:"
                          " found overlapping hints\n" ))
          }
#else
          count2 = 0;
#endif

          if ( count2 == 0 )
          {
            psh_hint_activate( hint );
            if ( count < table->max_hints )
              table->sort[count++] = hint;
            else
              FT_TRACE0(( "psh_hint_tableactivate_mask:"
                          " too many active hints\n" ));
          }
        }
      }

      mask >>= 1;
    }
    table->num_hints = count;

    /* now, sort the hints; they are guaranteed to not overlap */
    /* so we can compare their "org_pos" field directly        */
    {
      FT_UInt    i1, i2;
      PSH_Hint   hint1, hint2;
      PSH_Hint*  sort = table->sort;


      /* a simple bubble sort will do, since in 99% of cases, the hints */
      /* will be already sorted -- and the sort will be linear          */
      for ( i1 = 1; i1 < count; i1++ )
      {
        hint1 = sort[i1];
        /* this loop stops when i2 wraps around after reaching 0 */
        for ( i2 = i1 - 1; i2 < i1; i2-- )
        {
          hint2 = sort[i2];

          if ( hint2->org_pos < hint1->org_pos )
            break;

          sort[i2 + 1] = hint2;
          sort[i2]     = hint1;
        }
      }
    }
  }